

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O2

bool getScriptFromDescriptor(string *descriptor,CScript *script,string *error)

{
  long lVar1;
  Descriptor *pDVar2;
  int iVar3;
  const_reference pvVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  UniValue *pUVar5;
  size_type __n;
  long in_FS_OFFSET;
  allocator<char> local_279;
  vector<CScript,_std::allocator<CScript>_> scripts;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  string local_248;
  FlatSigningProvider provider;
  FlatSigningProvider key_provider;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  key_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &key_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  key_provider.super_SigningProvider._vptr_SigningProvider =
       (_func_int **)&PTR__FlatSigningProvider_01158e68;
  key_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  key_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  key_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  key_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &key_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  key_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  key_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  key_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  key_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &key_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
  key_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  key_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  key_provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  key_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &key_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
  key_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  key_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  key_provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  key_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &key_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
  key_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  key_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  key_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  key_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       key_provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  key_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       key_provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  key_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       key_provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  key_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       key_provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  key_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       key_provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Parse(&descs,descriptor,&key_provider,error,false);
  if (descs.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      descs.
      super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (8 < (ulong)((long)descs.
                          super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)descs.
                         super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)) {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&provider,"Multipath descriptor not accepted",
                 (allocator<char> *)&local_248);
      JSONRPCError(pUVar5,-8,(string *)&provider);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_008350ea;
    }
    pvVar4 = std::
             vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
             ::at(&descs,0);
    iVar3 = (*((pvVar4->_M_t).super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>.
               _M_t.super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
               super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl)->_vptr_Descriptor[2])();
    if ((char)iVar3 != '\0') {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&provider,
                 "Ranged descriptor not accepted. Maybe pass through deriveaddresses first?",
                 (allocator<char> *)&local_248);
      JSONRPCError(pUVar5,-8,(string *)&provider);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_008350ea;
    }
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.super_SigningProvider._vptr_SigningProvider =
         (_func_int **)&PTR__FlatSigningProvider_01158e68;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.origins._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.keys._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pDVar2 = (pvVar4->_M_t).super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t
             .super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
             super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
    provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.origins._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.keys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         provider.tr_trees._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar3 = (*pDVar2->_vptr_Descriptor[8])(pDVar2,0,&key_provider,&scripts,&provider,0);
    if ((char)iVar3 == '\0') {
      pUVar5 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"Cannot derive script without private keys",&local_279);
      JSONRPCError(pUVar5,-5,&local_248);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pUVar5,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_008350ea;
    }
    local_248._M_dataplus._M_p._0_1_ =
         (ulong)((long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                      super__Vector_impl_data._M_start) < 0x81 &&
         scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
         super__Vector_impl_data._M_start;
    inline_check_non_fatal<bool>
              ((bool *)&local_248,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/mining.cpp"
               ,0xc9,"getScriptFromDescriptor","scripts.size() > 0 && scripts.size() <= 4");
    __n = 0;
    if ((long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
              super__Vector_impl_data._M_start != 0x20) {
      __n = (ulong)((long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)scripts.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
                          super__Vector_impl_data._M_start == 0x80) + 1;
    }
    other = &std::vector<CScript,_std::allocator<CScript>_>::at(&scripts,__n)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=(&script->super_CScriptBase,other);
    std::vector<CScript,_std::allocator<CScript>_>::~vector(&scripts);
    FlatSigningProvider::~FlatSigningProvider(&provider);
  }
  std::
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  ::~vector(&descs);
  FlatSigningProvider::~FlatSigningProvider(&key_provider);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return descs.
           super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           descs.
           super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  }
LAB_008350ea:
  __stack_chk_fail();
}

Assistant:

static bool getScriptFromDescriptor(const std::string& descriptor, CScript& script, std::string& error)
{
    FlatSigningProvider key_provider;
    const auto descs = Parse(descriptor, key_provider, error, /* require_checksum = */ false);
    if (descs.empty()) return false;
    if (descs.size() > 1) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Multipath descriptor not accepted");
    }
    const auto& desc = descs.at(0);
    if (desc->IsRange()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Ranged descriptor not accepted. Maybe pass through deriveaddresses first?");
    }

    FlatSigningProvider provider;
    std::vector<CScript> scripts;
    if (!desc->Expand(0, key_provider, scripts, provider)) {
        throw JSONRPCError(RPC_INVALID_ADDRESS_OR_KEY, "Cannot derive script without private keys");
    }

    // Combo descriptors can have 2 or 4 scripts, so we can't just check scripts.size() == 1
    CHECK_NONFATAL(scripts.size() > 0 && scripts.size() <= 4);

    if (scripts.size() == 1) {
        script = scripts.at(0);
    } else if (scripts.size() == 4) {
        // For uncompressed keys, take the 3rd script, since it is p2wpkh
        script = scripts.at(2);
    } else {
        // Else take the 2nd script, since it is p2pkh
        script = scripts.at(1);
    }

    return true;
}